

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestGenericHandler::StartResultingXML
          (cmCTestGenericHandler *this,Part part,char *name,cmGeneratedFileStream *xofs)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmCTest *pcVar3;
  bool bVar4;
  size_t sVar5;
  ostream *poVar6;
  ostringstream cmCTestLog_msg_1;
  ostringstream ostr;
  string local_340;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  if (name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot create resulting XML file without providing the name",
               0x3b);
    std::ios::widen((char)(ostringstream *)local_1a8 +
                    (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x7c,(char *)local_320._0_8_,false);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return false;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  sVar5 = strlen(name);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,name,sVar5);
  if (0 < this->SubmitIndex) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
    std::ostream::operator<<(local_1a8,this->SubmitIndex);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".xml",4);
  cmCTest::GetCurrentTag_abi_cxx11_((string *)local_320,this->CTest);
  pcVar1 = local_320 + 0x10;
  if ((char *)local_320._0_8_ != pcVar1) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if (local_320._8_8_ == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,
               "Current Tag empty, this may mean NightlyStartTime / CTEST_NIGHTLY_START_TIME was not set correctly. Or maybe you forgot to call ctest_start() before calling ctest_configure()."
               ,0xaf);
    std::ios::widen((char)(ostream *)local_320 + (char)*(undefined8 *)(local_320._0_8_ + -0x18));
    std::ostream::put((char)local_320);
    std::ostream::flush();
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x8b,local_340._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  else {
    pcVar3 = this->CTest;
    cmCTest::GetCurrentTag_abi_cxx11_((string *)local_320,pcVar3);
    std::__cxx11::stringbuf::str();
    bVar4 = cmCTest::OpenOutputFile(pcVar3,(string *)local_320,&local_340,xofs,true);
    paVar2 = &local_340.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_320._0_8_ != pcVar1) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if (bVar4) {
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::AddSubmitFile(pcVar3,part,(string *)local_320);
      if ((char *)local_320._0_8_ != pcVar1) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      bVar4 = true;
      goto LAB_001c1d7d;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"Cannot create resulting XML file: ",0x22);
    std::__cxx11::stringbuf::str();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_320,local_340._M_dataplus._M_p,local_340._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x93,local_340._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
  }
  bVar4 = false;
LAB_001c1d7d:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return bVar4;
}

Assistant:

bool cmCTestGenericHandler::StartResultingXML(cmCTest::Part part,
                                              const char* name,
                                              cmGeneratedFileStream& xofs)
{
  if (!name) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create resulting XML file without providing the name"
                 << std::endl;);
    return false;
  }
  std::ostringstream ostr;
  ostr << name;
  if (this->SubmitIndex > 0) {
    ostr << "_" << this->SubmitIndex;
  }
  ostr << ".xml";
  if (this->CTest->GetCurrentTag().empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Current Tag empty, this may mean NightlyStartTime / "
               "CTEST_NIGHTLY_START_TIME was not set correctly. Or "
               "maybe you forgot to call ctest_start() before calling "
               "ctest_configure()."
                 << std::endl);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), ostr.str(),
                                   xofs, true)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create resulting XML file: " << ostr.str()
                                                    << std::endl);
    return false;
  }
  this->CTest->AddSubmitFile(part, ostr.str());
  return true;
}